

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__open_cloexec(char *path,int flags)

{
  int *piVar1;
  int fd;
  int flags_local;
  char *path_local;
  
  path_local._4_4_ = open(path,flags | 0x80000);
  if (path_local._4_4_ == -1) {
    piVar1 = __errno_location();
    path_local._4_4_ = -*piVar1;
  }
  return path_local._4_4_;
}

Assistant:

int uv__open_cloexec(const char* path, int flags) {
#if defined(O_CLOEXEC)
  int fd;

  fd = open(path, flags | O_CLOEXEC);
  if (fd == -1)
    return UV__ERR(errno);

  return fd;
#else  /* O_CLOEXEC */
  int err;
  int fd;

  fd = open(path, flags);
  if (fd == -1)
    return UV__ERR(errno);

  err = uv__cloexec(fd, 1);
  if (err) {
    uv__close(fd);
    return err;
  }

  return fd;
#endif  /* O_CLOEXEC */
}